

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ModelDescription::SerializeWithCachedSizes
          (ModelDescription *this,CodedOutputStream *output)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  FeatureDescription *pFVar4;
  long lVar5;
  char *pcVar6;
  string *psVar7;
  uint local_30;
  uint n_2;
  uint i_2;
  uint n_1;
  uint i_1;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  ModelDescription *this_local;
  
  i_1 = 0;
  uVar2 = input_size(this);
  for (; i_1 < uVar2; i_1 = i_1 + 1) {
    pFVar4 = input(this,i_1);
    google::protobuf::internal::WireFormatLite::WriteMessage(1,&pFVar4->super_MessageLite,output);
  }
  i_2 = 0;
  uVar2 = output_size(this);
  for (; i_2 < uVar2; i_2 = i_2 + 1) {
    pFVar4 = ModelDescription::output(this,i_2);
    google::protobuf::internal::WireFormatLite::WriteMessage(10,&pFVar4->super_MessageLite,output);
  }
  predictedfeaturename_abi_cxx11_(this);
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 0) {
    predictedfeaturename_abi_cxx11_(this);
    pcVar6 = (char *)std::__cxx11::string::data();
    predictedfeaturename_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar6,iVar3,SERIALIZE,"CoreML.Specification.ModelDescription.predictedFeatureName");
    psVar7 = predictedfeaturename_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0xb,psVar7,output);
  }
  predictedprobabilitiesname_abi_cxx11_(this);
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 0) {
    predictedprobabilitiesname_abi_cxx11_(this);
    pcVar6 = (char *)std::__cxx11::string::data();
    predictedprobabilitiesname_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar6,iVar3,SERIALIZE,
               "CoreML.Specification.ModelDescription.predictedProbabilitiesName");
    psVar7 = predictedprobabilitiesname_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(0xc,psVar7,output);
  }
  local_30 = 0;
  uVar2 = traininginput_size(this);
  for (; local_30 < uVar2; local_30 = local_30 + 1) {
    pFVar4 = traininginput(this,local_30);
    google::protobuf::internal::WireFormatLite::WriteMessage(0x32,&pFVar4->super_MessageLite,output)
    ;
  }
  bVar1 = has_metadata(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (100,&this->metadata_->super_MessageLite,output);
  }
  return;
}

Assistant:

void ModelDescription::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ModelDescription)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.FeatureDescription input = 1;
  for (unsigned int i = 0, n = this->input_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, this->input(i), output);
  }

  // repeated .CoreML.Specification.FeatureDescription output = 10;
  for (unsigned int i = 0, n = this->output_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      10, this->output(i), output);
  }

  // string predictedFeatureName = 11;
  if (this->predictedfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->predictedfeaturename().data(), this->predictedfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.ModelDescription.predictedFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      11, this->predictedfeaturename(), output);
  }

  // string predictedProbabilitiesName = 12;
  if (this->predictedprobabilitiesname().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->predictedprobabilitiesname().data(), this->predictedprobabilitiesname().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.ModelDescription.predictedProbabilitiesName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      12, this->predictedprobabilitiesname(), output);
  }

  // repeated .CoreML.Specification.FeatureDescription trainingInput = 50;
  for (unsigned int i = 0, n = this->traininginput_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      50, this->traininginput(i), output);
  }

  // .CoreML.Specification.Metadata metadata = 100;
  if (this->has_metadata()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      100, *this->metadata_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ModelDescription)
}